

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void str_append(char *dst,char *src,int dst_size)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (dst_size < 1) {
    dbg_msg("assert","%s(%d): %s",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
            ,0x823,"dst_size invalid");
    _DAT_00000000 = 0;
  }
  sVar3 = strlen(dst);
  iVar2 = (int)sVar3;
  if (dst_size - iVar2 != 0 && iVar2 <= dst_size) {
    uVar4 = 0;
    do {
      cVar1 = src[uVar4];
      dst[uVar4 + (long)iVar2] = cVar1;
      if (cVar1 == '\0') break;
      uVar4 = uVar4 + 1;
    } while ((uint)(dst_size - iVar2) != uVar4);
  }
  dst[(long)dst_size + -1] = '\0';
  return;
}

Assistant:

void str_append(char *dst, const char *src, int dst_size)
{
	int s;
	int i = 0;
	dbg_assert(dst_size > 0, "dst_size invalid");
	s = str_length(dst);
	while(s < dst_size)
	{
		dst[s] = src[i];
		if(!src[i]) /* check for null termination */
			break;
		s++;
		i++;
	}

	dst[dst_size-1] = 0; /* assure null termination */
}